

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest_Fac_Test::InterpTest_Fac_Test(InterpTest_Fac_Test *this)

{
  InterpTest_Fac_Test *this_local;
  
  InterpTest::InterpTest(&this->super_InterpTest);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_Fac_Test_003fb808;
  return;
}

Assistant:

TEST_F(InterpTest, Fac) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  Result result = func->Call(store_, {Value::Make(5)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(120u, results[0].Get<u32>());
}